

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3img.cpp
# Opt level: O1

void __thiscall CTcSymObj::mark_compiled_as_class(CTcSymObj *this)

{
  uint uVar1;
  CTcDataStream *stream;
  
  stream = CTcSymObjBase::get_stream_from_meta((this->super_CTcSymObjBase).metaclass_);
  uVar1 = CTPNStmObject::get_stream_obj_flags(stream,(this->super_CTcSymObjBase).stream_ofs_);
  CTPNStmObject::set_stream_obj_flags(stream,(this->super_CTcSymObjBase).stream_ofs_,uVar1 | 1);
  return;
}

Assistant:

void CTcSymObj::mark_compiled_as_class()
{
    uint flags;
    CTcDataStream *str;

    /* get the appropriate stream for generating the data */
    str = get_stream();
    
    /* get my original object flags */
    flags = CTPNStmObject::get_stream_obj_flags(str, stream_ofs_);

    /* add in the 'class' flag */
    flags |= TCT3_OBJFLG_CLASS;

    /* set the updated flags */
    CTPNStmObject::set_stream_obj_flags(str, stream_ofs_, flags);
}